

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  ggml_backend_sched_split *pgVar1;
  ggml_backend_t pgVar2;
  int *piVar3;
  ggml_tensor **ppgVar4;
  ggml_tensor *dst;
  _func_void_ggml_backend_t_ggml_backend_event_t *p_Var5;
  _func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr *p_Var6;
  _func_void_ggml_backend_t *p_Var7;
  bool bVar8;
  _Bool _Var9;
  ggml_status gVar10;
  size_t sVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  ggml_backend_event_t pgVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int i0;
  ggml_backend_t pgVar19;
  ggml_tensor *pgVar20;
  long lVar21;
  bool bVar22;
  ggml_status local_dc;
  ggml_tensor **local_b0;
  ggml_cgraph local_80;
  
  if ((sched->is_reset == false) && (sched->is_alloc == false)) {
    ggml_backend_sched_reset(sched);
  }
  if (sched->is_alloc == false) {
    _Var9 = ggml_backend_sched_alloc_graph(sched,graph);
    graph = (ggml_cgraph *)0xfffffffe;
    if (!_Var9) {
      return GGML_STATUS_ALLOC_FAILED;
    }
  }
  local_dc = (ggml_status)graph;
  bVar8 = 0 < sched->n_splits;
  if (0 < sched->n_splits) {
    pgVar1 = sched->splits;
    local_b0 = pgVar1->inputs;
    bVar8 = true;
    lVar21 = 0;
    do {
      local_dc = (ggml_status)graph;
      lVar14 = (long)pgVar1[lVar21].backend_id;
      pgVar2 = sched->backends[lVar14];
      if (0 < pgVar1[lVar21].n_inputs) {
        lVar16 = 0;
        do {
          piVar3 = sched->hv_tensor_backend_ids;
          sVar11 = ggml_hash_find_or_insert(&sched->hash_set,local_b0[lVar16]);
          if ((long)piVar3[sVar11] == -1) {
            pgVar19 = (ggml_backend_t)0x0;
          }
          else {
            pgVar19 = sched->backends[piVar3[sVar11]];
          }
          pgVar20 = local_b0[lVar16];
          ppgVar4 = sched->hv_tensor_copies;
          sVar11 = ggml_hash_find_or_insert(&sched->hash_set,pgVar20);
          dst = ppgVar4[(long)sched->n_backends * (long)sched->n_copies * sVar11 +
                        sched->n_copies * lVar14 + (long)sched->cur_copy];
          pgVar15 = sched->events[lVar14][sched->cur_copy];
          if ((pgVar20->flags & 1) == 0) {
            if (pgVar15 == (ggml_backend_event_t)0x0) {
              p_Var7 = (pgVar2->iface).synchronize;
              if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
                (*p_Var7)(pgVar2);
              }
            }
            else {
              p_Var5 = (pgVar2->iface).event_wait;
              if (p_Var5 == (_func_void_ggml_backend_t_ggml_backend_event_t *)0x0) {
                pcVar13 = "backend->iface.event_wait != NULL";
                iVar12 = 0x1bb;
                goto LAB_00127ec7;
              }
              (*p_Var5)(pgVar2,pgVar15);
            }
            p_Var6 = (pgVar2->iface).cpy_tensor_async;
            if ((p_Var6 == (_func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr
                            *)0x0) || (_Var9 = (*p_Var6)(pgVar19,pgVar2,pgVar20,dst), !_Var9)) {
              p_Var7 = (pgVar19->iface).synchronize;
              if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
                (*p_Var7)(pgVar19);
              }
              pgVar15 = sched->events[lVar14][sched->cur_copy];
              if (pgVar15 == (ggml_backend_event_t)0x0) goto LAB_00127c60;
LAB_00127c59:
              ggml_backend_event_synchronize(pgVar15);
              goto LAB_00127c6e;
            }
          }
          else {
            if (pgVar15 != (ggml_backend_event_t)0x0) goto LAB_00127c59;
LAB_00127c60:
            p_Var7 = (pgVar2->iface).synchronize;
            if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
              (*p_Var7)(pgVar2);
            }
LAB_00127c6e:
            ggml_backend_tensor_copy(pgVar20,dst);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pgVar1[lVar21].n_inputs);
      }
      if (sched->callback_eval == (ggml_backend_sched_eval_callback)0x0) {
        gVar10 = (*(pgVar2->iface).graph_compute)(pgVar2,&pgVar1[lVar21].graph);
        iVar12 = 1;
        bVar22 = gVar10 == GGML_STATUS_SUCCESS;
        if (!bVar22) {
          local_dc = gVar10;
        }
      }
      else {
        iVar12 = 8;
        if (0 < pgVar1[lVar21].graph.n_nodes) {
          i0 = 0;
          do {
            uVar17 = (ulong)i0;
            pgVar20 = pgVar1[lVar21].graph.nodes[uVar17];
            _Var9 = (*sched->callback_eval)(pgVar20,true,sched->callback_eval_user_data);
            iVar18 = i0;
            if ((!_Var9) && (i0 < pgVar1[lVar21].graph.n_nodes + -1)) {
              do {
                pgVar20 = pgVar1[lVar21].graph.nodes[uVar17 + 1];
                _Var9 = (*sched->callback_eval)(pgVar20,true,sched->callback_eval_user_data);
                if (_Var9) {
                  uVar17 = (ulong)((int)uVar17 + 1);
                  break;
                }
                uVar17 = uVar17 + 1;
              } while ((long)uVar17 < (long)pgVar1[lVar21].graph.n_nodes + -1);
              iVar18 = (int)uVar17;
            }
            ggml_graph_view(&local_80,&pgVar1[lVar21].graph,i0,iVar18 + 1);
            gVar10 = (*(pgVar2->iface).graph_compute)(pgVar2,&local_80);
            if (gVar10 == GGML_STATUS_SUCCESS) {
              p_Var7 = (pgVar2->iface).synchronize;
              if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
                (*p_Var7)(pgVar2);
              }
              if (_Var9 != false) {
                bVar22 = false;
                _Var9 = (*sched->callback_eval)(pgVar20,false,sched->callback_eval_user_data);
                if (!_Var9) {
                  iVar12 = 8;
                  goto LAB_00127db9;
                }
              }
              iVar12 = 0;
              bVar22 = true;
              i0 = iVar18;
            }
            else {
              iVar12 = 1;
              bVar22 = false;
              local_dc = gVar10;
            }
LAB_00127db9:
            if (!bVar22) goto LAB_00127e02;
            i0 = i0 + 1;
          } while (i0 < pgVar1[lVar21].graph.n_nodes);
          iVar12 = 8;
        }
LAB_00127e02:
        bVar22 = iVar12 == 8;
      }
      graph = (ggml_cgraph *)(ulong)(uint)local_dc;
      if (bVar22) {
        iVar12 = 0;
        if ((0 < pgVar1[lVar21].n_inputs) &&
           (pgVar15 = sched->events[lVar14][sched->cur_copy], iVar12 = 0,
           pgVar15 != (ggml_backend_event_t)0x0)) {
          p_Var5 = (pgVar2->iface).event_record;
          if (p_Var5 == (_func_void_ggml_backend_t_ggml_backend_event_t *)0x0) {
            pcVar13 = "backend->iface.event_record != NULL";
            iVar12 = 0x1af;
LAB_00127ec7:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                       ,iVar12,"GGML_ASSERT(%s) failed",pcVar13);
          }
          (*p_Var5)(pgVar2,pgVar15);
        }
      }
      if (iVar12 != 0) break;
      lVar21 = lVar21 + 1;
      local_b0 = local_b0 + 0x17;
      bVar8 = lVar21 < sched->n_splits;
    } while (lVar21 < sched->n_splits);
  }
  if (!bVar8) {
    sched->cur_copy = (sched->cur_copy + 1) % sched->n_copies;
    local_dc = GGML_STATUS_SUCCESS;
  }
  return local_dc;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    if (!sched->is_reset && !sched->is_alloc) {
        ggml_backend_sched_reset(sched);
    }

    if (!sched->is_alloc) {
        if (!ggml_backend_sched_alloc_graph(sched, graph)) {
            return GGML_STATUS_ALLOC_FAILED;
        }
    }

    return ggml_backend_sched_compute_splits(sched);
}